

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall vm::InvalidMemoryAccess::~InvalidMemoryAccess(InvalidMemoryAccess *this)

{
  ~InvalidMemoryAccess(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~InvalidMemoryAccess() {}